

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O1

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::~COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
           *this,void **vtt)

{
  code *pcVar1;
  _func_int **pp_Var2;
  ITexture *pIVar3;
  _func_int *p_Var4;
  void *pvVar5;
  pointer pEVar6;
  pointer ppIVar7;
  ulong uVar8;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IRenderTarget)._vptr_IRenderTarget = pp_Var2;
  *(void **)((long)&(this->super_IRenderTarget)._vptr_IRenderTarget + (long)pp_Var2[-3]) = vtt[3];
  if ((this->ColorAttachment != 0) && (this->BufferID != 0)) {
    (*GL.DeleteFramebuffers)(1,&this->BufferID);
  }
  ppIVar7 = (this->super_IRenderTarget).Textures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                          super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar7) >> 3) != 0) {
    uVar8 = 0;
    do {
      pIVar3 = ppIVar7[uVar8];
      if (pIVar3 != (ITexture *)0x0) {
        p_Var4 = pIVar3->_vptr_ITexture[0xfffffffffffffffd];
        pcVar1 = p_Var4 + 8 + (long)&(pIVar3->NamedPath).Path;
        *(int *)pcVar1 = *(int *)pcVar1 + -1;
        if (*(int *)pcVar1 == 0) {
          (**(code **)(*(long *)((long)&pIVar3->_vptr_ITexture + (long)p_Var4) + 8))();
        }
      }
      uVar8 = uVar8 + 1;
      ppIVar7 = (this->super_IRenderTarget).Textures.m_data.
                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < ((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                                    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar7) >> 3
                     & 0xffffffff));
  }
  pIVar3 = (this->super_IRenderTarget).DepthStencil;
  if (pIVar3 != (ITexture *)0x0) {
    p_Var4 = pIVar3->_vptr_ITexture[-3];
    pcVar1 = p_Var4 + 8 + (long)&(pIVar3->NamedPath).Path;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar3->_vptr_ITexture + (long)p_Var4) + 8))();
    }
  }
  pvVar5 = *(void **)&(this->super_IRenderTarget).field_0x58;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,*(long *)&(this->super_IRenderTarget).field_0x68 - (long)pvVar5);
  }
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_IRenderTarget)._vptr_IRenderTarget = pp_Var2;
  *(void **)((long)&(this->super_IRenderTarget)._vptr_IRenderTarget + (long)pp_Var2[-3]) = vtt[2];
  pEVar6 = (this->super_IRenderTarget).CubeSurfaces.m_data.
           super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pEVar6 != (pointer)0x0) {
    operator_delete(pEVar6,(long)(this->super_IRenderTarget).CubeSurfaces.m_data.
                                 super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar6);
  }
  ppIVar7 = (this->super_IRenderTarget).Textures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar7 != (pointer)0x0) {
    operator_delete(ppIVar7,(long)(this->super_IRenderTarget).Textures.m_data.
                                  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar7
                   );
    return;
  }
  return;
}

Assistant:

virtual ~COpenGLCoreRenderTarget()
	{
		if (ColorAttachment > 0 && BufferID != 0)
			Driver->irrGlDeleteFramebuffers(1, &BufferID);

		for (u32 i = 0; i < Textures.size(); ++i) {
			if (Textures[i])
				Textures[i]->drop();
		}

		if (DepthStencil)
			DepthStencil->drop();
	}